

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_line(p_ply ply)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  char *end;
  p_ply ply_local;
  
  if (((ply != (p_ply)0x0) && (ply->fp != (FILE *)0x0)) && (ply->io_mode == PLY_READ)) {
    pcVar4 = strchr(ply->buffer + ply->buffer_first,10);
    if (pcVar4 == (char *)0x0) {
      sVar1 = ply->buffer_last;
      sVar2 = ply->buffer_first;
      iVar3 = BREFILL(ply);
      if (iVar3 == 0) {
        ply_ferror(ply,"Unexpected end of file");
        ply_local._4_4_ = 0;
      }
      else {
        pcVar4 = strchr((char *)((long)ply + (sVar1 - sVar2) + 0x48),10);
        if (pcVar4 == (char *)0x0) {
          ply_ferror(ply,"Token too large");
          ply_local._4_4_ = 0;
        }
        else {
          ply->buffer_token = ply->buffer_first;
          ply->buffer_first =
               (size_t)(pcVar4 + (ply->buffer_first - (long)(ply->buffer + ply->buffer_first)));
          ply->buffer[ply->buffer_first] = '\0';
          ply->buffer_first = ply->buffer_first + 1;
          ply_local._4_4_ = ply_check_line(ply);
        }
      }
    }
    else {
      ply->buffer_token = ply->buffer_first;
      ply->buffer_first =
           (size_t)(pcVar4 + (ply->buffer_first - (long)(ply->buffer + ply->buffer_first)));
      ply->buffer[ply->buffer_first] = '\0';
      ply->buffer_first = ply->buffer_first + 1;
      ply_local._4_4_ = ply_check_line(ply);
    }
    return ply_local._4_4_;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x3fa,"int ply_read_line(p_ply)");
}

Assistant:

static int ply_read_line(p_ply ply) {
    const char *end = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    /* look for a end of line */
    end = strchr(BFIRST(ply), '\n');
    /* if we didn't reach the end of the buffer, we are done */
    if (end) {
        ply->buffer_token = ply->buffer_first;
        BSKIP(ply, end - BFIRST(ply));
        *BFIRST(ply) = '\0';
        BSKIP(ply, 1);
        return ply_check_line(ply);
    } else {
        end = ply->buffer + BSIZE(ply);
        /* otherwise, try to refill buffer */
        if (!BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
    }
    /* keep looking from where we left */
    end = strchr(end, '\n');
    /* check if the token is too large for our buffer */
    if (!end) {
        ply_ferror(ply, "Token too large");
        return 0;
    }
    /* we are done */
    ply->buffer_token = ply->buffer_first;
    BSKIP(ply, end - BFIRST(ply));
    *BFIRST(ply) = '\0';
    BSKIP(ply, 1);
    return ply_check_line(ply);
}